

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::LoadIniSettingsFromMemory(char *ini_data,size_t ini_size)

{
  ImGuiContext *pIVar1;
  char *__dest;
  char *pcVar2;
  char *pcVar3;
  bool bVar4;
  ImGuiSettingsHandler *local_88;
  char *name_start;
  char *type_end;
  char *type_start;
  char *name_end;
  char *line;
  char *line_end;
  ImGuiSettingsHandler *entry_handler;
  void *entry_data;
  char *buf_end;
  char *buf;
  ImGuiContext *g;
  size_t ini_size_local;
  char *ini_data_local;
  
  pIVar1 = GImGui;
  if ((GImGui->Initialized & 1U) == 0) {
    __assert_fail("g.Initialized",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui.cpp"
                  ,0x251f,"void ImGui::LoadIniSettingsFromMemory(const char *, size_t)");
  }
  bVar4 = false;
  if ((GImGui->SettingsLoaded & 1U) == 0) {
    bVar4 = GImGui->FrameCount == 0;
  }
  if (bVar4) {
    g = (ImGuiContext *)ini_size;
    if (ini_size == 0) {
      g = (ImGuiContext *)strlen(ini_data);
    }
    __dest = (char *)MemAlloc((size_t)&g->FontAtlasOwnedByContext);
    memcpy(__dest,ini_data,(size_t)g);
    __dest[(long)g] = '\0';
    entry_handler = (ImGuiSettingsHandler *)0x0;
    line_end = (char *)0x0;
    name_end = __dest;
    while (name_end < __dest + (long)g) {
      while( true ) {
        bVar4 = true;
        if (*name_end != '\n') {
          bVar4 = *name_end == '\r';
        }
        if (!bVar4) break;
        name_end = name_end + 1;
      }
      line = name_end;
      while( true ) {
        bVar4 = false;
        if ((line < __dest + (long)g) && (bVar4 = false, *line != '\n')) {
          bVar4 = *line != '\r';
        }
        if (!bVar4) break;
        line = line + 1;
      }
      *line = '\0';
      if (*name_end != ';') {
        if (((*name_end == '[') && (name_end < line)) && (line[-1] == ']')) {
          line[-1] = '\0';
          pcVar2 = ImStrchrRange(name_end + 1,line + -1,']');
          if ((pcVar2 != (char *)0x0) &&
             (pcVar3 = ImStrchrRange(pcVar2 + 1,line + -1,'['), pcVar3 != (char *)0x0)) {
            *pcVar2 = '\0';
            line_end = (char *)FindSettingsHandler(name_end + 1);
            if ((ImGuiSettingsHandler *)line_end == (ImGuiSettingsHandler *)0x0) {
              local_88 = (ImGuiSettingsHandler *)0x0;
            }
            else {
              local_88 = (ImGuiSettingsHandler *)
                         (*((ImGuiSettingsHandler *)line_end)->ReadOpenFn)
                                   (pIVar1,(ImGuiSettingsHandler *)line_end,pcVar3 + 1);
            }
            entry_handler = local_88;
          }
        }
        else if ((line_end != (char *)0x0) && (entry_handler != (ImGuiSettingsHandler *)0x0)) {
          (**(code **)(line_end + 0x18))(pIVar1,line_end,entry_handler,name_end);
        }
      }
      name_end = line + 1;
    }
    MemFree(__dest);
    pIVar1->SettingsLoaded = true;
    return;
  }
  __assert_fail("g.SettingsLoaded == false && g.FrameCount == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui.cpp"
                ,0x2520,"void ImGui::LoadIniSettingsFromMemory(const char *, size_t)");
}

Assistant:

void ImGui::LoadIniSettingsFromMemory(const char* ini_data, size_t ini_size)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(g.Initialized);
    IM_ASSERT(g.SettingsLoaded == false && g.FrameCount == 0);

    // For user convenience, we allow passing a non zero-terminated string (hence the ini_size parameter).
    // For our convenience and to make the code simpler, we'll also write zero-terminators within the buffer. So let's create a writable copy..
    if (ini_size == 0)
        ini_size = strlen(ini_data);
    char* buf = (char*)IM_ALLOC(ini_size + 1);
    char* buf_end = buf + ini_size;
    memcpy(buf, ini_data, ini_size);
    buf[ini_size] = 0;

    void* entry_data = NULL;
    ImGuiSettingsHandler* entry_handler = NULL;

    char* line_end = NULL;
    for (char* line = buf; line < buf_end; line = line_end + 1)
    {
        // Skip new lines markers, then find end of the line
        while (*line == '\n' || *line == '\r')
            line++;
        line_end = line;
        while (line_end < buf_end && *line_end != '\n' && *line_end != '\r')
            line_end++;
        line_end[0] = 0;
        if (line[0] == ';')
            continue;
        if (line[0] == '[' && line_end > line && line_end[-1] == ']')
        {
            // Parse "[Type][Name]". Note that 'Name' can itself contains [] characters, which is acceptable with the current format and parsing code.
            line_end[-1] = 0;
            const char* name_end = line_end - 1;
            const char* type_start = line + 1;
            char* type_end = (char*)(void*)ImStrchrRange(type_start, name_end, ']');
            const char* name_start = type_end ? ImStrchrRange(type_end + 1, name_end, '[') : NULL;
            if (!type_end || !name_start)
                continue;
            *type_end = 0; // Overwrite first ']'
            name_start++;  // Skip second '['
            entry_handler = FindSettingsHandler(type_start);
            entry_data = entry_handler ? entry_handler->ReadOpenFn(&g, entry_handler, name_start) : NULL;
        }
        else if (entry_handler != NULL && entry_data != NULL)
        {
            // Let type handler parse the line
            entry_handler->ReadLineFn(&g, entry_handler, entry_data, line);
        }
    }
    IM_FREE(buf);
    g.SettingsLoaded = true;
}